

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O0

void BrotliBuildAndStoreHuffmanTreeFast
               (MemoryManager *m,uint32_t *histogram,size_t histogram_total,size_t max_bits,
               uint8_t *depth,uint16_t *bits,size_t *storage_ix,uint8_t *storage)

{
  HuffmanTree *pHVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  HuffmanTree HVar5;
  size_t sVar6;
  size_t sVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  HuffmanTree HVar11;
  bool bVar12;
  HuffmanTree *local_668;
  ulong local_660;
  size_t k_2;
  size_t reps;
  ulong uStack_648;
  uint8_t value;
  size_t i_4;
  uint8_t previous_value;
  size_t __brotli_swap_tmp;
  size_t j_3;
  size_t i_3;
  int right;
  int left;
  int k;
  int j;
  int i;
  HuffmanTree sentinel;
  int n;
  size_t l;
  HuffmanTree *node;
  uint32_t count_limit;
  HuffmanTree *tree;
  size_t max_tree_size;
  size_t total;
  size_t length;
  size_t symbols [4];
  ulong local_5a0;
  size_t count;
  uint16_t *bits_local;
  uint8_t *depth_local;
  size_t max_bits_local;
  size_t histogram_total_local;
  uint32_t *histogram_local;
  MemoryManager *m_local;
  uint64_t v_18;
  uint8_t *p_18;
  uint64_t v_17;
  uint8_t *p_17;
  uint64_t v_16;
  uint8_t *p_16;
  uint64_t v_15;
  uint8_t *p_15;
  uint64_t v_13;
  uint8_t *p_13;
  uint64_t v_12;
  uint8_t *p_12;
  uint64_t v_11;
  uint8_t *p_11;
  uint64_t v_10;
  uint8_t *p_10;
  uint64_t v_9;
  uint8_t *p_9;
  uint64_t v_8;
  uint8_t *p_8;
  uint64_t v_7;
  uint8_t *p_7;
  uint64_t v_6;
  uint8_t *p_6;
  uint64_t v_5;
  uint8_t *p_5;
  uint64_t v_4;
  uint8_t *p_4;
  uint64_t v_3;
  uint8_t *p_3;
  uint64_t v_2;
  uint8_t *p_2;
  uint64_t v_1;
  uint8_t *p_1;
  uint64_t v;
  uint8_t *p;
  HuffmanTree local_1d8;
  HuffmanTree tmp_1;
  size_t j_2;
  size_t i_2;
  size_t gap;
  HuffmanTree HStack_1b0;
  int g;
  size_t j_1;
  size_t k_1;
  HuffmanTree tmp;
  size_t i_1;
  uint64_t v_14;
  uint8_t *p_14;
  
  local_5a0 = 0;
  memset(&length,0,0x20);
  total = 0;
  max_tree_size = histogram_total;
  while (max_tree_size != 0) {
    if (histogram[total] != 0) {
      if (local_5a0 < 4) {
        symbols[local_5a0 - 1] = total;
      }
      local_5a0 = local_5a0 + 1;
      max_tree_size = max_tree_size - histogram[total];
    }
    total = total + 1;
  }
  if (local_5a0 < 2) {
    *(ulong *)(storage + (*storage_ix >> 3)) =
         1L << ((byte)*storage_ix & 7) | (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
    *storage_ix = *storage_ix + 4;
    *(size_t *)(storage + (*storage_ix >> 3)) =
         length << ((byte)*storage_ix & 7) | (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
    *storage_ix = max_bits + *storage_ix;
    depth[length] = '\0';
    bits[length] = 0;
    return;
  }
  memset(depth,0,total);
  lVar10 = total * 2 + 1;
  if (lVar10 == 0) {
    local_668 = (HuffmanTree *)0x0;
  }
  else {
    local_668 = (HuffmanTree *)BrotliAllocate(m,lVar10 * 8);
  }
  node._4_4_ = 1;
  do {
    l = (size_t)local_668;
    stack0xfffffffffffffa00 = total;
    while (stack0xfffffffffffffa00 != 0) {
      register0x00000000 = stack0xfffffffffffffa00 - 1;
      if (histogram[register0x00000000] != 0) {
        if (histogram[register0x00000000] < node._4_4_) {
          *(uint *)l = node._4_4_;
          *(undefined2 *)(l + 4) = 0xffff;
          *(short *)(l + 6) = (short)register0x00000000;
        }
        else {
          *(uint32_t *)l = histogram[register0x00000000];
          *(undefined2 *)(l + 4) = 0xffff;
          *(short *)(l + 6) = (short)register0x00000000;
        }
        l = l + 8;
      }
    }
    iVar9 = (int)((long)(l - (long)local_668) >> 3);
    k = 0;
    left = iVar9 + 1;
    HVar11 = (HuffmanTree)(long)iVar9;
    if ((ulong)HVar11 < 0xd) {
      tmp.total_count_ = 1;
      tmp.index_left_ = 0;
      tmp.index_right_or_value_ = 0;
      for (; (ulong)tmp < (ulong)HVar11; tmp = (HuffmanTree)((long)tmp + 1)) {
        k_1 = *(size_t *)(local_668 + (long)tmp);
        j_1 = (size_t)tmp;
        do {
          HStack_1b0 = (HuffmanTree)(j_1 - 1);
          iVar8 = SortHuffmanTree((HuffmanTree *)&k_1,local_668 + (long)HStack_1b0);
          if (iVar8 == 0) break;
          local_668[j_1] = local_668[(long)HStack_1b0];
          j_1 = (size_t)HStack_1b0;
        } while (HStack_1b0 != (HuffmanTree)0x0);
        pHVar1 = local_668 + j_1;
        pHVar1->total_count_ = (undefined4)k_1;
        pHVar1->index_left_ = k_1._4_2_;
        pHVar1->index_right_or_value_ = k_1._6_2_;
      }
    }
    else {
      gap._4_4_ = 0;
      if ((ulong)HVar11 < 0x39) {
        gap._4_4_ = 2;
      }
      for (; gap._4_4_ < 6; gap._4_4_ = gap._4_4_ + 1) {
        HVar5 = *(HuffmanTree *)(SortHuffmanTreeItems_gaps + (long)gap._4_4_ * 8);
        for (j_2 = (size_t)HVar5; j_2 < (ulong)HVar11; j_2 = j_2 + 1) {
          tmp_1.total_count_ = (undefined4)j_2;
          tmp_1.index_left_ = j_2._4_2_;
          tmp_1.index_right_or_value_ = j_2._6_2_;
          local_1d8 = local_668[j_2];
          while( true ) {
            bVar12 = false;
            if ((ulong)HVar5 <= (ulong)tmp_1) {
              iVar8 = SortHuffmanTree(&local_1d8,local_668 + ((long)tmp_1 - (long)HVar5));
              bVar12 = iVar8 != 0;
            }
            if (!bVar12) break;
            local_668[(long)tmp_1] = local_668[(long)tmp_1 - (long)HVar5];
            tmp_1 = (HuffmanTree)((long)tmp_1 - (long)HVar5);
          }
          local_668[(long)tmp_1] = local_1d8;
        }
      }
    }
    j = -1;
    i._0_2_ = 0xffff;
    i._2_2_ = 0xffff;
    *(undefined8 *)l = _j;
    *(undefined8 *)(l + 8) = _j;
    l = l + 0x10;
    right = iVar9;
    while (right = right + -1, 0 < right) {
      if (local_668[left].total_count_ < local_668[k].total_count_) {
        i_3._4_4_ = left;
        left = left + 1;
      }
      else {
        i_3._4_4_ = k;
        k = k + 1;
      }
      if (local_668[left].total_count_ < local_668[k].total_count_) {
        i_3._0_4_ = left;
        left = left + 1;
      }
      else {
        i_3._0_4_ = k;
        k = k + 1;
      }
      *(uint32_t *)(l - 8) = local_668[i_3._4_4_].total_count_ + local_668[(int)i_3].total_count_;
      *(short *)(l - 4) = (short)i_3._4_4_;
      *(short *)(l - 2) = (short)(int)i_3;
      *(undefined8 *)l = _j;
      l = l + 8;
    }
    iVar9 = BrotliSetDepth(iVar9 * 2 + -1,local_668,depth,0xe);
    if (iVar9 != 0) {
      BrotliFree(m,local_668);
      BrotliConvertBitDepthsToSymbols(depth,total,bits);
      if (4 < local_5a0) {
        i_4._7_1_ = 8;
        *(ulong *)(storage + (*storage_ix >> 3)) =
             0xff55555554 << ((byte)*storage_ix & 7) |
             (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
        *storage_ix = *storage_ix + 0x28;
        uStack_648 = 0;
        while (uStack_648 < total) {
          bVar2 = depth[uStack_648];
          k_2 = 1;
          local_660 = uStack_648;
          while( true ) {
            local_660 = local_660 + 1;
            bVar12 = false;
            if (local_660 < total) {
              bVar12 = depth[local_660] == bVar2;
            }
            if (!bVar12) break;
            k_2 = k_2 + 1;
          }
          uStack_648 = k_2 + uStack_648;
          if (bVar2 == 0) {
            uVar4 = kZeroRepsDepth[k_2];
            *(uint64_t *)(storage + (*storage_ix >> 3)) =
                 kZeroRepsBits[k_2] << ((byte)*storage_ix & 7) |
                 (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
            *storage_ix = (ulong)uVar4 + *storage_ix;
          }
          else {
            if (i_4._7_1_ != bVar2) {
              bVar3 = "\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x05\x05"[bVar2];
              *(ulong *)(storage + (*storage_ix >> 3)) =
                   (ulong)kCodeLengthBits[bVar2] << ((byte)*storage_ix & 7) |
                   (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
              *storage_ix = (ulong)bVar3 + *storage_ix;
              k_2 = k_2 - 1;
            }
            i_4._7_1_ = bVar2;
            if (k_2 < 3) {
              while (k_2 != 0) {
                k_2 = k_2 - 1;
                bVar3 = "\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x05\x05"[bVar2];
                *(ulong *)(storage + (*storage_ix >> 3)) =
                     (ulong)kCodeLengthBits[bVar2] << ((byte)*storage_ix & 7) |
                     (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
                *storage_ix = (ulong)bVar3 + *storage_ix;
              }
            }
            else {
              uVar4 = kNonZeroRepsDepth[k_2 - 3];
              *(uint64_t *)(storage + (*storage_ix >> 3)) =
                   kNonZeroRepsBits[k_2 - 3] << ((byte)*storage_ix & 7) |
                   (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
              *storage_ix = (ulong)uVar4 + *storage_ix;
            }
          }
        }
        return;
      }
      *(ulong *)(storage + (*storage_ix >> 3)) =
           1L << ((byte)*storage_ix & 7) | (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
      *storage_ix = *storage_ix + 2;
      *(ulong *)(storage + (*storage_ix >> 3)) =
           local_5a0 - 1 << ((byte)*storage_ix & 7) |
           (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
      *storage_ix = *storage_ix + 2;
      for (j_3 = 0; sVar6 = j_3, j_3 < local_5a0; j_3 = j_3 + 1) {
        while (sVar7 = sVar6, __brotli_swap_tmp = sVar7 + 1, __brotli_swap_tmp < local_5a0) {
          sVar6 = __brotli_swap_tmp;
          if (depth[symbols[sVar7]] < depth[symbols[j_3 - 1]]) {
            sVar6 = symbols[sVar7];
            symbols[sVar7] = symbols[j_3 - 1];
            symbols[j_3 - 1] = sVar6;
            sVar6 = __brotli_swap_tmp;
          }
        }
      }
      if (local_5a0 == 2) {
        *(size_t *)(storage + (*storage_ix >> 3)) =
             length << ((byte)*storage_ix & 7) |
             (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
        *storage_ix = max_bits + *storage_ix;
        *(size_t *)(storage + (*storage_ix >> 3)) =
             symbols[0] << ((byte)*storage_ix & 7) |
             (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
        *storage_ix = max_bits + *storage_ix;
        return;
      }
      if (local_5a0 == 3) {
        *(size_t *)(storage + (*storage_ix >> 3)) =
             length << ((byte)*storage_ix & 7) |
             (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
        *storage_ix = max_bits + *storage_ix;
        *(size_t *)(storage + (*storage_ix >> 3)) =
             symbols[0] << ((byte)*storage_ix & 7) |
             (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
        *storage_ix = max_bits + *storage_ix;
        *(size_t *)(storage + (*storage_ix >> 3)) =
             symbols[1] << ((byte)*storage_ix & 7) |
             (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
        *storage_ix = max_bits + *storage_ix;
        return;
      }
      *(size_t *)(storage + (*storage_ix >> 3)) =
           length << ((byte)*storage_ix & 7) | (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3))
      ;
      *storage_ix = max_bits + *storage_ix;
      *(size_t *)(storage + (*storage_ix >> 3)) =
           symbols[0] << ((byte)*storage_ix & 7) |
           (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
      *storage_ix = max_bits + *storage_ix;
      *(size_t *)(storage + (*storage_ix >> 3)) =
           symbols[1] << ((byte)*storage_ix & 7) |
           (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
      *storage_ix = max_bits + *storage_ix;
      *(size_t *)(storage + (*storage_ix >> 3)) =
           symbols[2] << ((byte)*storage_ix & 7) |
           (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
      *storage_ix = max_bits + *storage_ix;
      *(ulong *)(storage + (*storage_ix >> 3)) =
           (long)(int)(uint)(depth[length] == '\x01') << ((byte)*storage_ix & 7) |
           (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
      *storage_ix = *storage_ix + 1;
      return;
    }
    node._4_4_ = node._4_4_ << 1;
  } while( true );
}

Assistant:

void BrotliBuildAndStoreHuffmanTreeFast(MemoryManager* m,
                                        const uint32_t* histogram,
                                        const size_t histogram_total,
                                        const size_t max_bits,
                                        uint8_t* depth, uint16_t* bits,
                                        size_t* storage_ix,
                                        uint8_t* storage) {
  size_t count = 0;
  size_t symbols[4] = { 0 };
  size_t length = 0;
  size_t total = histogram_total;
  while (total != 0) {
    if (histogram[length]) {
      if (count < 4) {
        symbols[count] = length;
      }
      ++count;
      total -= histogram[length];
    }
    ++length;
  }

  if (count <= 1) {
    BrotliWriteBits(4, 1, storage_ix, storage);
    BrotliWriteBits(max_bits, symbols[0], storage_ix, storage);
    depth[symbols[0]] = 0;
    bits[symbols[0]] = 0;
    return;
  }

  memset(depth, 0, length * sizeof(depth[0]));
  {
    const size_t max_tree_size = 2 * length + 1;
    HuffmanTree* tree = BROTLI_ALLOC(m, HuffmanTree, max_tree_size);
    uint32_t count_limit;
    if (BROTLI_IS_OOM(m)) return;
    for (count_limit = 1; ; count_limit *= 2) {
      HuffmanTree* node = tree;
      size_t l;
      for (l = length; l != 0;) {
        --l;
        if (histogram[l]) {
          if (BROTLI_PREDICT_TRUE(histogram[l] >= count_limit)) {
            InitHuffmanTree(node, histogram[l], -1, (int16_t)l);
          } else {
            InitHuffmanTree(node, count_limit, -1, (int16_t)l);
          }
          ++node;
        }
      }
      {
        const int n = (int)(node - tree);
        HuffmanTree sentinel;
        int i = 0;      /* Points to the next leaf node. */
        int j = n + 1;  /* Points to the next non-leaf node. */
        int k;

        SortHuffmanTreeItems(tree, (size_t)n, SortHuffmanTree);
        /* The nodes are:
           [0, n): the sorted leaf nodes that we start with.
           [n]: we add a sentinel here.
           [n + 1, 2n): new parent nodes are added here, starting from
                        (n+1). These are naturally in ascending order.
           [2n]: we add a sentinel at the end as well.
           There will be (2n+1) elements at the end. */
        InitHuffmanTree(&sentinel, BROTLI_UINT32_MAX, -1, -1);
        *node++ = sentinel;
        *node++ = sentinel;

        for (k = n - 1; k > 0; --k) {
          int left, right;
          if (tree[i].total_count_ <= tree[j].total_count_) {
            left = i;
            ++i;
          } else {
            left = j;
            ++j;
          }
          if (tree[i].total_count_ <= tree[j].total_count_) {
            right = i;
            ++i;
          } else {
            right = j;
            ++j;
          }
          /* The sentinel node becomes the parent node. */
          node[-1].total_count_ =
              tree[left].total_count_ + tree[right].total_count_;
          node[-1].index_left_ = (int16_t)left;
          node[-1].index_right_or_value_ = (int16_t)right;
          /* Add back the last sentinel node. */
          *node++ = sentinel;
        }
        if (BrotliSetDepth(2 * n - 1, tree, depth, 14)) {
          /* We need to pack the Huffman tree in 14 bits. If this was not
             successful, add fake entities to the lowest values and retry. */
          break;
        }
      }
    }
    BROTLI_FREE(m, tree);
  }
  BrotliConvertBitDepthsToSymbols(depth, length, bits);
  if (count <= 4) {
    size_t i;
    /* value of 1 indicates a simple Huffman code */
    BrotliWriteBits(2, 1, storage_ix, storage);
    BrotliWriteBits(2, count - 1, storage_ix, storage);  /* NSYM - 1 */

    /* Sort */
    for (i = 0; i < count; i++) {
      size_t j;
      for (j = i + 1; j < count; j++) {
        if (depth[symbols[j]] < depth[symbols[i]]) {
          BROTLI_SWAP(size_t, symbols, j, i);
        }
      }
    }

    if (count == 2) {
      BrotliWriteBits(max_bits, symbols[0], storage_ix, storage);
      BrotliWriteBits(max_bits, symbols[1], storage_ix, storage);
    } else if (count == 3) {
      BrotliWriteBits(max_bits, symbols[0], storage_ix, storage);
      BrotliWriteBits(max_bits, symbols[1], storage_ix, storage);
      BrotliWriteBits(max_bits, symbols[2], storage_ix, storage);
    } else {
      BrotliWriteBits(max_bits, symbols[0], storage_ix, storage);
      BrotliWriteBits(max_bits, symbols[1], storage_ix, storage);
      BrotliWriteBits(max_bits, symbols[2], storage_ix, storage);
      BrotliWriteBits(max_bits, symbols[3], storage_ix, storage);
      /* tree-select */
      BrotliWriteBits(1, depth[symbols[0]] == 1 ? 1 : 0, storage_ix, storage);
    }
  } else {
    uint8_t previous_value = 8;
    size_t i;
    /* Complex Huffman Tree */
    StoreStaticCodeLengthCode(storage_ix, storage);

    /* Actual RLE coding. */
    for (i = 0; i < length;) {
      const uint8_t value = depth[i];
      size_t reps = 1;
      size_t k;
      for (k = i + 1; k < length && depth[k] == value; ++k) {
        ++reps;
      }
      i += reps;
      if (value == 0) {
        BrotliWriteBits(kZeroRepsDepth[reps], kZeroRepsBits[reps],
                        storage_ix, storage);
      } else {
        if (previous_value != value) {
          BrotliWriteBits(kCodeLengthDepth[value], kCodeLengthBits[value],
                          storage_ix, storage);
          --reps;
        }
        if (reps < 3) {
          while (reps != 0) {
            reps--;
            BrotliWriteBits(kCodeLengthDepth[value], kCodeLengthBits[value],
                            storage_ix, storage);
          }
        } else {
          reps -= 3;
          BrotliWriteBits(kNonZeroRepsDepth[reps], kNonZeroRepsBits[reps],
                          storage_ix, storage);
        }
        previous_value = value;
      }
    }
  }
}